

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void DitherRow(VP8Decoder *dec)

{
  long in_RDI;
  uint8_t *v_dst;
  uint8_t *u_dst;
  int uv_bps;
  int cache_id;
  VP8MBData *data;
  VP8ThreadContext *ctx;
  int mb_x;
  undefined4 local_c;
  
  for (local_c = *(int *)(in_RDI + 0x1a0); local_c < *(int *)(in_RDI + 0x1a8); local_c = local_c + 1
      ) {
    if (3 < *(byte *)(*(long *)(in_RDI + 0xf0) + (long)local_c * 800 + 0x31c)) {
      Dither8x8((VP8Random *)ctx,(uint8_t *)data,cache_id,uv_bps);
      Dither8x8((VP8Random *)ctx,(uint8_t *)data,cache_id,uv_bps);
    }
  }
  return;
}

Assistant:

static void DitherRow(VP8Decoder* const dec) {
  int mb_x;
  assert(dec->dither_);
  for (mb_x = dec->tl_mb_x_; mb_x < dec->br_mb_x_; ++mb_x) {
    const VP8ThreadContext* const ctx = &dec->thread_ctx_;
    const VP8MBData* const data = ctx->mb_data_ + mb_x;
    const int cache_id = ctx->id_;
    const int uv_bps = dec->cache_uv_stride_;
    if (data->dither_ >= MIN_DITHER_AMP) {
      uint8_t* const u_dst = dec->cache_u_ + cache_id * 8 * uv_bps + mb_x * 8;
      uint8_t* const v_dst = dec->cache_v_ + cache_id * 8 * uv_bps + mb_x * 8;
      Dither8x8(&dec->dithering_rg_, u_dst, uv_bps, data->dither_);
      Dither8x8(&dec->dithering_rg_, v_dst, uv_bps, data->dither_);
    }
  }
}